

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::loops_plusloop_check(Forth *this)

{
  int iVar1;
  ForthStack<unsigned_int> *this_00;
  uint Value;
  uint uVar2;
  uint uVar3;
  ForthStack<unsigned_int> *this_01;
  uint x;
  
  requireRStackDepth(this,2,"plusloop_check");
  requireDStackDepth(this,1,"plusloop_check");
  requireDStackAvailable(this,2,"plusloop_check");
  this_00 = &this->rStack;
  Value = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  this_01 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_01);
  iVar1 = Value - 1;
  x = uVar3 + uVar2;
  if (loops_plusloop_check::conditions[(int)uVar3 < 1][(int)uVar2 < 1]
      [x == 0 || SCARRY4(uVar3,uVar2) != (int)x < 0] == 1) {
    if (((int)Value <= (int)x && (int)uVar2 <= iVar1) ||
       ((int)Value <= (int)uVar2 && (int)x <= iVar1)) {
      uVar2 = 0xffffffff;
      goto LAB_0010daa7;
    }
  }
  else if ((int)Value > (int)x || (int)uVar2 > iVar1) {
    uVar2 = -(uint)((int)uVar2 < (int)Value || iVar1 < (int)x);
    goto LAB_0010daa7;
  }
  uVar2 = 0;
LAB_0010daa7:
  ForthStack<unsigned_int>::setTop(this_01,Value);
  ForthStack<unsigned_int>::push(this_01,x);
  ForthStack<unsigned_int>::push(this_01,uVar2);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  return;
}

Assistant:

void loops_plusloop_check() {
			// conditions : first index is the sign of increment (0 => +, 1 => -)
			// second index is the sign of index  (0 => +, 1 => -)
			// third index is the sign of newIndex  (0 => +, 1 => -)
			// value: 1 - compare as usual, 0 - compare considering integer overflow
			static int conditions[2][2][2] = { 
				{ { 1, 0 }, { 1, 1 }}, // positive increment
				{ { 1, 1 }, { 0, 1 }}  // negative increment
			};
			REQUIRE_RSTACK_DEPTH(2, "plusloop_check");
			REQUIRE_DSTACK_DEPTH(1, "plusloop_check");
			REQUIRE_DSTACK_AVAILABLE(2, "plusloop_check");
    		SCell limit = static_cast<SCell>(rStack.getTop()); // limit of loop
			SCell index = static_cast<SCell>(rStack.getTop(1)); // current index of loop
			SCell increment = static_cast<SCell>(dStack.getTop()); // increment of loop from stack
			SCell limitMinus1 = limit==0x80000000?limit:limit - 1;   // limit and limit-1 - the border to cross as exit test for loop
			SCell newIndex = index + increment; // if newIndex crossed the border, than the loop is finished
			int signIndex = index > 0 ? 0 : 1;
			int signNewIndex = newIndex > 0 ? 0 : 1;
			int signIncrement = increment > 0 ? 0 : 1;
			int compare = conditions[signIncrement][signIndex][signNewIndex];
			SCell result = 0;
			if (compare == 1){
				if (((index <= limitMinus1) && (newIndex >= limit)) || ((newIndex <= limitMinus1) && (index >= limit))){
					result = -1;
				}
			}
			else {
				if (!(((index <= limitMinus1) && (newIndex >= limit)) || ((newIndex <= limitMinus1) && (index >= limit)))){
					result = -1;
				}
			}
			dStack.setTop(static_cast<SCell>(limit));
			dStack.push(static_cast<SCell>(newIndex));
			dStack.push(result);
			rStack.pop();
			rStack.pop();
		}